

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  byte *pbVar1;
  u32 *puVar2;
  u8 uVar3;
  short sVar4;
  sqlite3 *psVar5;
  SrcList *pSVar6;
  Vdbe *p_00;
  Parse *pPVar7;
  byte bVar8;
  ushort uVar9;
  LogEst LVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int p2;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  Vdbe *pVVar19;
  int *zP4;
  ExprList *pEVar20;
  KeyInfo *pKVar21;
  CollSeq *pCVar22;
  Op *pOVar23;
  Expr *pEVar24;
  char *pcVar25;
  long lVar26;
  anon_union_4_2_6146edf4_for_u *paVar27;
  Select *pSVar28;
  int iVar29;
  int extraout_EDX;
  int iVar30;
  int nExtra;
  char *pcVar31;
  ushort uVar32;
  int iVar33;
  Select *pSVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  Select *pSVar38;
  bool bVar39;
  int local_114;
  SelectDest destA;
  SelectDest dest;
  KeyInfo *local_60;
  SelectDest local_50;
  
  psVar5 = pParse->db;
  pSVar38 = p->pPrior;
  dest.eDest = pDest->eDest;
  dest._1_3_ = *(undefined3 *)&pDest->field_0x1;
  dest.iSDParm = pDest->iSDParm;
  dest.iSdst = pDest->iSdst;
  dest.nSdst = pDest->nSdst;
  dest.zAffSdst._0_4_ = *(undefined4 *)&pDest->zAffSdst;
  dest.zAffSdst._4_4_ = *(undefined4 *)((long)&pDest->zAffSdst + 4);
  dest.pOrderBy._0_4_ = *(undefined4 *)&pDest->pOrderBy;
  dest.pOrderBy._4_4_ = *(undefined4 *)((long)&pDest->pOrderBy + 4);
  if (pSVar38->pOrderBy == (ExprList *)0x0) {
    if (pSVar38->pLimit == (Expr *)0x0) {
      pVVar19 = sqlite3GetVdbe(pParse);
      if (dest.eDest == '\f') {
        sqlite3VdbeAddOp3(pVVar19,0x71,dest.iSDParm,p->pEList->nExpr,0);
        dest.eDest = '\x0e';
      }
      if ((p->selFlags >> 10 & 1) == 0) {
        if ((p->selFlags >> 0xd & 1) == 0) {
          pEVar20 = p->pOrderBy;
          if (pEVar20 != (ExprList *)0x0) {
            psVar5 = pParse->db;
            pVVar19 = pParse->pVdbe;
            iVar35 = pParse->nLabel;
            iVar29 = iVar35 + -2;
            pParse->nLabel = iVar29;
            uVar3 = p->op;
            pSVar38 = p->pPrior;
            iVar15 = pEVar20->nExpr;
            if ((uVar3 != 0x80) && (psVar5->mallocFailed == '\0')) {
              uVar36 = 1;
              do {
                if (p->pEList->nExpr < (int)uVar36) break;
                if (iVar15 < 1) {
                  iVar30 = 0;
                }
                else {
                  paVar27 = &pEVar20->a[0].u;
                  iVar16 = 0;
                  do {
                    iVar30 = iVar16;
                    if (uVar36 == (paVar27->x).iOrderByCol) break;
                    iVar16 = iVar16 + 1;
                    paVar27 = paVar27 + 8;
                    iVar30 = iVar15;
                  } while (iVar15 != iVar16);
                }
                bVar39 = true;
                if (iVar30 == iVar15) {
                  destA.eDest = '\0';
                  destA._1_3_ = 0;
                  destA.iSDParm = 0;
                  destA._8_8_ = destA._8_8_ & 0xffffffff00000000;
                  pEVar24 = sqlite3ExprAlloc(psVar5,0x93,(Token *)&destA,0);
                  bVar39 = pEVar24 != (Expr *)0x0;
                  if (bVar39) {
                    pbVar1 = (byte *)((long)&pEVar24->flags + 1);
                    *pbVar1 = *pbVar1 | 4;
                    (pEVar24->u).iValue = uVar36;
                    pEVar20 = sqlite3ExprListAppend(pParse,pEVar20,pEVar24);
                    p->pOrderBy = pEVar20;
                    bVar39 = true;
                    if (pEVar20 != (ExprList *)0x0) {
                      lVar26 = (long)iVar15;
                      iVar15 = iVar15 + 1;
                      pEVar20->a[lVar26].u.x.iOrderByCol = (u16)uVar36;
                      bVar39 = true;
                    }
                  }
                }
                if (!bVar39) {
                  return 7;
                }
                uVar36 = uVar36 + 1;
              } while (psVar5->mallocFailed == '\0');
            }
            zP4 = (int *)sqlite3DbMallocRawNN(psVar5,(long)iVar15 * 4 + 4);
            if (zP4 == (int *)0x0) {
              local_60 = (KeyInfo *)0x0;
            }
            else {
              *zP4 = iVar15;
              iVar30 = extraout_EDX;
              if (0 < iVar15) {
                lVar26 = 0;
                do {
                  iVar30 = (&pEVar20->a[0].u)[lVar26 * 2].x.iOrderByCol - 1;
                  *(int *)((long)zP4 + lVar26 + 4) = iVar30;
                  lVar26 = lVar26 + 4;
                } while ((ulong)(iVar15 + 1) * 4 + -4 != lVar26);
              }
              local_60 = multiSelectOrderByKeyInfo(pParse,p,iVar30);
            }
            p->pOrderBy = pEVar20;
            pEVar20 = sqlite3ExprListDup(pParse->db,pEVar20,0);
            pSVar38->pOrderBy = pEVar20;
            uVar36 = p->pEList->nExpr;
            iVar30 = pParse->nMem + 1;
            pParse->nMem = pParse->nMem + uVar36 + 1;
            sqlite3VdbeAddOp3(pVVar19,0x46,0,iVar30,0);
            pKVar21 = sqlite3KeyInfoAlloc(psVar5,uVar36,1);
            if (0 < (int)uVar36 && pKVar21 != (KeyInfo *)0x0) {
              uVar18 = 0;
              do {
                pCVar22 = multiSelectCollSeq(pParse,p,(int)uVar18);
                pKVar21->aColl[uVar18] = pCVar22;
                pKVar21->aSortOrder[uVar18] = '\0';
                uVar18 = uVar18 + 1;
              } while (uVar36 != uVar18);
            }
            iVar35 = iVar35 + -1;
            p->pPrior = (Select *)0x0;
            pSVar38->pNext = (Select *)0x0;
            sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
            if (pSVar38->pPrior == (Select *)0x0) {
              sqlite3ResolveOrderGroupBy(pParse,pSVar38,pSVar38->pOrderBy,"ORDER");
            }
            computeLimitRegisters(pParse,p,iVar35);
            if (p->pLimit != (Expr *)0x0) {
              sqlite3ExprDeleteNN(psVar5,p->pLimit);
            }
            p->pLimit = (Expr *)0x0;
            iVar33 = pParse->nMem;
            iVar16 = iVar33 + 1;
            iVar17 = iVar33 + 2;
            iVar37 = iVar33 + 4;
            pParse->nMem = iVar37;
            destA.eDest = '\r';
            destA.iSDParm = iVar16;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            local_50.eDest = '\r';
            local_50.iSdst = 0;
            local_50.nSdst = 0;
            local_50.zAffSdst = (char *)0x0;
            iVar33 = iVar33 + 3;
            local_50.iSDParm = iVar17;
            sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
            iVar11 = sqlite3VdbeAddOp3(pVVar19,0xd,iVar16,0,pVVar19->nOp + 1);
            pSVar38->iLimit = 0;
            sqlite3VdbeExplain(pParse,'\x01',"LEFT");
            sqlite3Select(pParse,pSVar38,&destA);
            sqlite3VdbeAddOp3(pVVar19,0x43,iVar16,0,0);
            pPVar7 = pVVar19->pParse;
            pPVar7->nTempReg = '\0';
            pPVar7->nRangeReg = 0;
            iVar13 = pVVar19->nOp;
            if (pVVar19->db->mallocFailed == '\0') {
              iVar12 = iVar13 + -1;
              if (-1 < iVar11) {
                iVar12 = iVar11;
              }
              pOVar23 = pVVar19->aOp + iVar12;
            }
            else {
              pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar23->p2 = iVar13;
            iVar12 = sqlite3VdbeAddOp3(pVVar19,0xd,iVar17,0,iVar13 + 1);
            iVar13 = p->iLimit;
            iVar11 = p->iOffset;
            p->iLimit = 0;
            p->iOffset = 0;
            sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
            sqlite3Select(pParse,p,&local_50);
            p->iLimit = iVar13;
            p->iOffset = iVar11;
            sqlite3VdbeAddOp3(pVVar19,0x43,iVar17,0,0);
            pPVar7 = pVVar19->pParse;
            pPVar7->nTempReg = '\0';
            iVar13 = 0;
            pPVar7->nRangeReg = 0;
            iVar11 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar33,iVar30,pKVar21,iVar35);
            if ((byte)(uVar3 + 0x81) < 2) {
              iVar13 = generateOutputSubroutine
                                 (pParse,p,&local_50,pDest,iVar37,iVar30,pKVar21,iVar35);
            }
            if ((pKVar21 != (KeyInfo *)0x0) &&
               (pKVar21->nRef = pKVar21->nRef - 1, pKVar21->nRef == 0)) {
              sqlite3DbFreeNN(pKVar21->db,pKVar21);
            }
            iVar14 = iVar35;
            iVar30 = iVar35;
            if (1 < (byte)(uVar3 + 0x7f)) {
              iVar14 = sqlite3VdbeAddOp3(pVVar19,0xc,iVar37,iVar13,0);
              iVar30 = sqlite3VdbeAddOp3(pVVar19,0xe,iVar17,iVar35,0);
              sqlite3VdbeAddOp3(pVVar19,0xb,0,iVar14,0);
              LVar10 = sqlite3LogEstAdd(p->nSelectRow,pSVar38->nSelectRow);
              p->nSelectRow = LVar10;
            }
            if (uVar3 == 0x82) {
              p2 = iVar14;
              if (pSVar38->nSelectRow < p->nSelectRow) {
                p->nSelectRow = pSVar38->nSelectRow;
              }
            }
            else {
              p2 = sqlite3VdbeAddOp3(pVVar19,0xc,iVar33,iVar11,0);
              sqlite3VdbeAddOp3(pVVar19,0xe,iVar16,iVar35,0);
              sqlite3VdbeAddOp3(pVVar19,0xb,0,p2,0);
            }
            iVar33 = sqlite3VdbeAddOp3(pVVar19,0xc,iVar33,iVar11,0);
            sqlite3VdbeAddOp3(pVVar19,0xe,iVar16,iVar14,0);
            sqlite3VdbeAddOp3(pVVar19,0xb,0,iVar29,0);
            if (uVar3 == 0x82) {
              iVar11 = iVar33 + 1;
              iVar14 = iVar33;
            }
            else {
              iVar14 = sqlite3VdbeAddOp3(pVVar19,0xe,iVar16,iVar14,0);
              sqlite3VdbeAddOp3(pVVar19,0xb,0,iVar29,0);
              iVar11 = iVar33;
            }
            iVar33 = pVVar19->nOp;
            if ((byte)(uVar3 + 0x81) < 2) {
              sqlite3VdbeAddOp3(pVVar19,0xc,iVar37,iVar13,0);
            }
            sqlite3VdbeAddOp3(pVVar19,0xe,iVar17,p2,0);
            sqlite3VdbeAddOp3(pVVar19,0xb,0,iVar29,0);
            if (pVVar19->db->mallocFailed == '\0') {
              iVar37 = pVVar19->nOp + -1;
              if (-1 < iVar12) {
                iVar37 = iVar12;
              }
              pOVar23 = pVVar19->aOp + iVar37;
            }
            else {
              pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar23->p2 = pVVar19->nOp;
            sqlite3VdbeAddOp3(pVVar19,0xe,iVar16,iVar30,0);
            sqlite3VdbeAddOp3(pVVar19,0xe,iVar17,p2,0);
            sqlite3VdbeResolveLabel(pVVar19,iVar29);
            iVar29 = sqlite3VdbeAddOp3(pVVar19,0x56,0,0,0);
            sqlite3VdbeChangeP4(pVVar19,iVar29,(char *)zP4,-0xf);
            iVar15 = sqlite3VdbeAddOp3(pVVar19,0x57,destA.iSdst,local_50.iSdst,iVar15);
            sqlite3VdbeChangeP4(pVVar19,iVar15,(char *)local_60,-9);
            if (0 < (long)pVVar19->nOp) {
              pVVar19->aOp[(long)pVVar19->nOp + -1].p5 = 1;
            }
            sqlite3VdbeAddOp3(pVVar19,0x10,iVar11,iVar14,iVar33);
            sqlite3VdbeResolveLabel(pVVar19,iVar35);
            if (p->pPrior != (Select *)0x0) {
              clearSelect(psVar5,p->pPrior,1);
            }
            p->pPrior = pSVar38;
            pSVar38->pNext = p;
            sqlite3VdbeExplainPop(pParse);
            return (uint)(pParse->nErr != 0);
          }
          if (pSVar38->pPrior == (Select *)0x0) {
            sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
            sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
          }
          uVar3 = p->op;
          if ((uVar3 == '\x7f') || (uVar3 == 0x81)) {
            uVar3 = dest.eDest;
            iVar15 = dest.iSDParm;
            if (dest.eDest != '\x01') {
              iVar15 = pParse->nTab;
              pParse->nTab = iVar15 + 1;
              iVar35 = sqlite3VdbeAddOp3(pVVar19,0x71,iVar15,0,0);
              p->addrOpenEphm[0] = iVar35;
              pSVar34 = p;
              do {
                pSVar28 = pSVar34;
                pSVar34 = pSVar28->pNext;
              } while (pSVar34 != (Select *)0x0);
              puVar2 = &pSVar28->selFlags;
              *(byte *)puVar2 = (byte)*puVar2 | 0x20;
            }
            destA.eDest = '\x01';
            destA.iSDParm = iVar15;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            iVar29 = sqlite3Select(pParse,pSVar38,&destA);
            if (iVar29 == 0) {
              p->pPrior = (Select *)0x0;
              pEVar24 = p->pLimit;
              p->pLimit = (Expr *)0x0;
              destA.eDest = ((ulong)p->op == 0x81) + '\x01';
              uVar18 = (ulong)p->op ^ 0x80;
              if ((byte)uVar18 < 3) {
                pcVar31 = (&PTR_anon_var_dwarf_32ed2_00236dc0)[uVar18];
              }
              else {
                pcVar31 = "UNION";
              }
              sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar31);
              iVar35 = sqlite3Select(pParse,p,&destA);
              if (p->pOrderBy != (ExprList *)0x0) {
                exprListDeleteNN(psVar5,p->pOrderBy);
              }
              pSVar34 = p->pPrior;
              p->pPrior = pSVar38;
              p->pOrderBy = (ExprList *)0x0;
              if (p->op == '\x7f') {
                LVar10 = sqlite3LogEstAdd(p->nSelectRow,pSVar38->nSelectRow);
                p->nSelectRow = LVar10;
              }
              if (p->pLimit != (Expr *)0x0) {
                sqlite3ExprDeleteNN(psVar5,p->pLimit);
              }
              p->pLimit = pEVar24;
              p->iLimit = 0;
              p->iOffset = 0;
              if (uVar3 != '\x01') {
                iVar30 = pParse->nLabel + -1;
                iVar17 = pParse->nLabel + -2;
                pParse->nLabel = iVar17;
                computeLimitRegisters(pParse,p,iVar30);
                sqlite3VdbeAddOp3(pVVar19,0x24,iVar15,iVar30,0);
                iVar16 = pVVar19->nOp;
                selectInnerLoop(pParse,p,iVar15,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar17,
                                iVar30);
                sqlite3VdbeResolveLabel(pVVar19,iVar17);
                sqlite3VdbeAddOp3(pVVar19,5,iVar15,iVar16,0);
                sqlite3VdbeResolveLabel(pVVar19,iVar30);
                sqlite3VdbeAddOp3(pVVar19,0x75,iVar15,0,0);
              }
            }
            else {
              pSVar34 = (Select *)0x0;
              iVar35 = iVar29;
            }
          }
          else if (uVar3 == 0x80) {
            pSVar38->iLimit = p->iLimit;
            pSVar38->iOffset = p->iOffset;
            pSVar38->pLimit = p->pLimit;
            iVar29 = sqlite3Select(pParse,pSVar38,&dest);
            p->pLimit = (Expr *)0x0;
            if (iVar29 == 0) {
              iVar15 = 0;
              p->pPrior = (Select *)0x0;
              iVar35 = pSVar38->iLimit;
              p->iLimit = iVar35;
              p->iOffset = pSVar38->iOffset;
              if (iVar35 != 0) {
                iVar15 = sqlite3VdbeAddOp3(pVVar19,0x14,iVar35,0,0);
                iVar35 = p->iOffset;
                if (iVar35 != 0) {
                  sqlite3VdbeAddOp3(pVVar19,0x98,p->iLimit,iVar35 + 1,iVar35);
                }
              }
              sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
              iVar35 = sqlite3Select(pParse,p,&dest);
              pSVar34 = p->pPrior;
              p->pPrior = pSVar38;
              LVar10 = sqlite3LogEstAdd(p->nSelectRow,pSVar38->nSelectRow);
              p->nSelectRow = LVar10;
              if (pSVar38->pLimit != (Expr *)0x0) {
                iVar30 = sqlite3ExprIsInteger(pSVar38->pLimit->pLeft,(int *)&destA);
                if ((0 < (int)destA._0_4_ && iVar30 != 0) &&
                   (sVar4 = p->nSelectRow, LVar10 = sqlite3LogEst(destA._0_8_ & 0xffffffff),
                   LVar10 < sVar4)) {
                  p->nSelectRow = LVar10;
                }
              }
              if (iVar15 != 0) {
                if (pVVar19->db->mallocFailed == '\0') {
                  iVar30 = pVVar19->nOp + -1;
                  if (-1 < iVar15) {
                    iVar30 = iVar15;
                  }
                  pOVar23 = pVVar19->aOp + iVar30;
                }
                else {
                  pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar23->p2 = pVVar19->nOp;
              }
            }
            else {
              pSVar34 = (Select *)0x0;
              iVar35 = iVar29;
            }
          }
          else {
            iVar15 = pParse->nTab;
            pParse->nTab = iVar15 + 2;
            iVar35 = sqlite3VdbeAddOp3(pVVar19,0x71,iVar15,0,0);
            p->addrOpenEphm[0] = iVar35;
            pSVar34 = p;
            do {
              pSVar28 = pSVar34;
              pSVar34 = pSVar28->pNext;
            } while (pSVar34 != (Select *)0x0);
            puVar2 = &pSVar28->selFlags;
            *(byte *)puVar2 = (byte)*puVar2 | 0x20;
            destA.eDest = '\x01';
            destA.iSDParm = iVar15;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            iVar29 = sqlite3Select(pParse,pSVar38,&destA);
            if (iVar29 == 0) {
              iVar30 = iVar15 + 1;
              iVar35 = sqlite3VdbeAddOp3(pVVar19,0x71,iVar30,0,0);
              p->addrOpenEphm[1] = iVar35;
              p->pPrior = (Select *)0x0;
              pEVar24 = p->pLimit;
              p->pLimit = (Expr *)0x0;
              destA.iSDParm = iVar30;
              uVar18 = (ulong)p->op ^ 0x80;
              if ((byte)uVar18 < 3) {
                pcVar31 = (&PTR_anon_var_dwarf_32ed2_00236dc0)[uVar18];
              }
              else {
                pcVar31 = "UNION";
              }
              sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar31);
              iVar35 = sqlite3Select(pParse,p,&destA);
              pSVar34 = p->pPrior;
              p->pPrior = pSVar38;
              if (pSVar38->nSelectRow < p->nSelectRow) {
                p->nSelectRow = pSVar38->nSelectRow;
              }
              if (p->pLimit != (Expr *)0x0) {
                sqlite3ExprDeleteNN(psVar5,p->pLimit);
              }
              p->pLimit = pEVar24;
              iVar16 = pParse->nLabel + -1;
              iVar17 = pParse->nLabel + -2;
              pParse->nLabel = iVar17;
              computeLimitRegisters(pParse,p,iVar16);
              sqlite3VdbeAddOp3(pVVar19,0x24,iVar15,iVar16,0);
              if (pParse->nTempReg == '\0') {
                iVar37 = pParse->nMem + 1;
                pParse->nMem = iVar37;
              }
              else {
                bVar8 = pParse->nTempReg - 1;
                pParse->nTempReg = bVar8;
                iVar37 = pParse->aTempReg[bVar8];
              }
              iVar33 = sqlite3VdbeAddOp3(pVVar19,0x7f,iVar15,iVar37,0);
              iVar13 = sqlite3VdbeAddOp3(pVVar19,0x1c,iVar30,iVar17,iVar37);
              if (pVVar19->db->mallocFailed == '\0') {
                pOVar23 = pVVar19->aOp;
                pOVar23[iVar13].p4type = -3;
                pOVar23[iVar13].p4.i = 0;
              }
              if (iVar37 != 0) {
                bVar8 = pParse->nTempReg;
                if ((ulong)bVar8 < 8) {
                  pParse->nTempReg = bVar8 + 1;
                  pParse->aTempReg[bVar8] = iVar37;
                }
              }
              selectInnerLoop(pParse,p,iVar15,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar17,iVar16)
              ;
              sqlite3VdbeResolveLabel(pVVar19,iVar17);
              sqlite3VdbeAddOp3(pVVar19,5,iVar15,iVar33,0);
              sqlite3VdbeResolveLabel(pVVar19,iVar16);
              sqlite3VdbeAddOp3(pVVar19,0x75,iVar30,0,0);
              sqlite3VdbeAddOp3(pVVar19,0x75,iVar15,0,0);
            }
            else {
              pSVar34 = (Select *)0x0;
              iVar35 = iVar29;
            }
          }
          if (iVar29 != 0) goto LAB_0018caee;
          if (p->pNext == (Select *)0x0) {
            sqlite3VdbeExplainPop(pParse);
          }
        }
        else {
          if (p->pWin == (Window *)0x0) {
            pSVar6 = p->pSrc;
            iVar35 = p->pEList->nExpr;
            p_00 = pParse->pVdbe;
            pSVar38 = p->pPrior;
            iVar15 = 0;
            iVar29 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
            if (iVar29 == 0) {
              iVar16 = pParse->nLabel + -1;
              pParse->nLabel = iVar16;
              p->nSelectRow = 0x140;
              computeLimitRegisters(pParse,p,iVar16);
              pEVar24 = p->pLimit;
              iVar29 = p->iLimit;
              iVar30 = p->iOffset;
              p->pLimit = (Expr *)0x0;
              p->iLimit = 0;
              p->iOffset = 0;
              if (0 < (long)pSVar6->nSrc) {
                lVar26 = 0;
                do {
                  if (((&pSVar6->a[0].fg.field_0x1)[lVar26] & 0x20) != 0) {
                    iVar15 = *(int *)((long)&pSVar6->a[0].iCursor + lVar26);
                    goto LAB_0018d7e9;
                  }
                  lVar26 = lVar26 + 0x70;
                } while ((long)pSVar6->nSrc * 0x70 - lVar26 != 0);
                iVar15 = 0;
              }
LAB_0018d7e9:
              pEVar20 = p->pOrderBy;
              iVar17 = pParse->nTab;
              local_114 = iVar17 + 1;
              pParse->nTab = local_114;
              if (p->op == '\x7f') {
                bVar8 = (pEVar20 != (ExprList *)0x0) * '\x02' + 6;
                pParse->nTab = iVar17 + 2;
              }
              else {
                bVar8 = (pEVar20 != (ExprList *)0x0) * '\x02' | 5;
                local_114 = 0;
              }
              destA.eDest = bVar8;
              destA.iSDParm = iVar17;
              destA.iSdst = 0;
              destA.nSdst = 0;
              destA.zAffSdst = (char *)0x0;
              iVar37 = pParse->nMem + 1;
              pParse->nMem = iVar37;
              sqlite3VdbeAddOp3(p_00,0x74,iVar15,iVar37,iVar35);
              if (pEVar20 == (ExprList *)0x0) {
                sqlite3VdbeAddOp3(p_00,0x71,iVar17,iVar35,0);
              }
              else {
                pKVar21 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
                iVar35 = sqlite3VdbeAddOp3(p_00,0x71,iVar17,pEVar20->nExpr + 2,0);
                sqlite3VdbeChangeP4(p_00,iVar35,(char *)pKVar21,-9);
                destA.pOrderBy = pEVar20;
              }
              if (local_114 != 0) {
                iVar35 = sqlite3VdbeAddOp3(p_00,0x71,local_114,0,0);
                p->addrOpenEphm[0] = iVar35;
                *(byte *)&p->selFlags = (byte)p->selFlags | 0x20;
              }
              p->pOrderBy = (ExprList *)0x0;
              pSVar38->pNext = (Select *)0x0;
              sqlite3VdbeExplain(pParse,'\x01',"SETUP");
              iVar35 = sqlite3Select(pParse,pSVar38,&destA);
              pSVar38->pNext = p;
              if (iVar35 == 0) {
                iVar35 = sqlite3VdbeAddOp3(p_00,0x24,iVar17,iVar16,0);
                sqlite3VdbeAddOp3(p_00,0x81,iVar15,0,0);
                if (pEVar20 == (ExprList *)0x0) {
                  iVar11 = 0x7f;
                  iVar13 = 0;
                  iVar33 = iVar37;
                }
                else {
                  iVar11 = 0x5a;
                  iVar33 = pEVar20->nExpr + 1;
                  iVar13 = iVar37;
                }
                sqlite3VdbeAddOp3(p_00,iVar11,iVar17,iVar33,iVar13);
                sqlite3VdbeAddOp3(p_00,0x7b,iVar17,0,0);
                iVar17 = pParse->nLabel + -1;
                pParse->nLabel = iVar17;
                if (0 < iVar30) {
                  sqlite3VdbeAddOp3(p_00,0x2f,iVar30,iVar17,1);
                }
                selectInnerLoop(pParse,p,iVar15,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar17,
                                iVar16);
                if (iVar29 != 0) {
                  sqlite3VdbeAddOp3(p_00,0x31,iVar29,iVar16,0);
                }
                sqlite3VdbeResolveLabel(p_00,iVar17);
                if ((p->selFlags & 8) == 0) {
                  p->pPrior = (Select *)0x0;
                  sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
                  sqlite3Select(pParse,p,&destA);
                  p->pPrior = pSVar38;
                }
                else {
                  sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
                }
                sqlite3VdbeAddOp3(p_00,0xb,0,iVar35,0);
                sqlite3VdbeResolveLabel(p_00,iVar16);
              }
              if (p->pOrderBy != (ExprList *)0x0) {
                exprListDeleteNN(pParse->db,p->pOrderBy);
              }
              p->pOrderBy = pEVar20;
              p->pLimit = pEVar24;
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
          }
          pSVar34 = (Select *)0x0;
          iVar35 = 0;
        }
        if ((p->selFlags & 0x20) != 0) {
          iVar15 = p->pEList->nExpr;
          pKVar21 = sqlite3KeyInfoAlloc(psVar5,iVar15,1);
          if (pKVar21 == (KeyInfo *)0x0) {
            iVar35 = 7;
          }
          else {
            if (0 < iVar15) {
              lVar26 = 0;
              do {
                pCVar22 = multiSelectCollSeq(pParse,p,(int)lVar26);
                pKVar21->aColl[lVar26] = pCVar22;
                if (pCVar22 == (CollSeq *)0x0) {
                  pKVar21->aColl[lVar26] = psVar5->pDfltColl;
                }
                lVar26 = lVar26 + 1;
              } while (iVar15 != (int)lVar26);
            }
            if (p != (Select *)0x0) {
              do {
                lVar26 = 0;
                do {
                  iVar29 = p->addrOpenEphm[lVar26];
                  if ((long)iVar29 < 0) break;
                  pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (pVVar19->db->mallocFailed == '\0') {
                    pOVar23 = pVVar19->aOp + iVar29;
                  }
                  pOVar23->p2 = iVar15;
                  pKVar21->nRef = pKVar21->nRef + 1;
                  sqlite3VdbeChangeP4(pVVar19,iVar29,(char *)pKVar21,-9);
                  p->addrOpenEphm[lVar26] = -1;
                  lVar26 = lVar26 + 1;
                } while (lVar26 == 1);
                p = p->pPrior;
              } while (p != (Select *)0x0);
            }
            pKVar21->nRef = pKVar21->nRef - 1;
            if (pKVar21->nRef == 0) {
              sqlite3DbFreeNN(pKVar21->db,pKVar21);
            }
          }
        }
      }
      else {
        pEVar24 = p->pLimit;
        uVar9 = (ushort)(pEVar24 == (Expr *)0x0);
        uVar32 = uVar9 ^ 1;
        do {
          pSVar38 = p;
          uVar32 = uVar32 + uVar9;
          p = pSVar38->pPrior;
        } while (pSVar38->pPrior != (Select *)0x0);
        sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
        if (pSVar38 == (Select *)0x0) {
          pSVar34 = (Select *)0x0;
          iVar35 = 0;
        }
        else {
          do {
            pSVar34 = (Select *)0x0;
            selectInnerLoop(pParse,pSVar38,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,1,1);
            iVar35 = 0;
            if (pEVar24 != (Expr *)0x0) break;
            pSVar38->nSelectRow = uVar32;
            pSVar38 = pSVar38->pNext;
            pSVar34 = (Select *)0x0;
            iVar35 = 0;
          } while (pSVar38 != (Select *)0x0);
        }
      }
      goto LAB_0018caee;
    }
    pcVar31 = "LIMIT";
  }
  else {
    pcVar31 = "ORDER BY";
  }
  uVar18 = (ulong)p->op ^ 0x80;
  if ((byte)uVar18 < 3) {
    pcVar25 = (&PTR_anon_var_dwarf_32ed2_00236dc0)[uVar18];
  }
  else {
    pcVar25 = "UNION";
  }
  pSVar34 = (Select *)0x0;
  sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",pcVar31,pcVar25);
  iVar35 = 1;
LAB_0018caee:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if (pSVar34 != (Select *)0x0) {
    clearSelect(psVar5,pSVar34,1);
  }
  return iVar35;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  if( pPrior->pOrderBy || pPrior->pLimit ){
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
      pPrior->pOrderBy!=0 ? "ORDER BY" : "LIMIT", selectOpName(p->op));
    rc = 1;
    goto multi_select_end;
  }

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    goto multi_select_end;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( p->selFlags & SF_Recursive ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit;
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        rc = sqlite3Select(pParse, pPrior, &dest);
        p->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( pPrior->pLimit
         && sqlite3ExprIsInteger(pPrior->pLimit->pLeft, &nLimit)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit) 
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;
  
        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }
  
        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        /* Query flattening in sqlite3Select() might refill p->pOrderBy.
        ** Be sure to delete p->pOrderBy, therefore, to avoid a memory leak. */
        sqlite3ExprListDelete(db, p->pOrderBy);
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;
  
        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        if( dest.eDest!=priorOp ){
          int iCont, iBreak, iStart;
          assert( p->pEList );
          iBreak = sqlite3VdbeMakeLabel(pParse);
          iCont = sqlite3VdbeMakeLabel(pParse);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;
  
        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );
  
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );
  
        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
  
        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(pParse);
        iCont = sqlite3VdbeMakeLabel(pParse);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }
  
  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  
  /* Compute collating sequences used by 
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  sqlite3SelectDelete(db, pDelete);
  return rc;
}